

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O1

value_type_conflict5 __thiscall
vigra::colormap<unsigned_char,_float>::operator()
          (colormap<unsigned_char,_float> *this,domain_type index,uint band)

{
  uint uVar1;
  int iVar2;
  PreconditionViolation *this_00;
  uint uVar3;
  undefined7 in_register_00000031;
  
  uVar1 = this->m_numTableElements;
  uVar3 = (uint)CONCAT71(in_register_00000031,index);
  if (uVar1 <= uVar3) {
    this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this_00,"index out of range",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
               ,0xed);
LAB_0014a382:
    __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
  }
  if (this->m_numTables == 1) {
    if (this->m_numTableBands <= band) {
      this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
      PreconditionViolation::PreconditionViolation
                (this_00,"band out of range",
                 "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
                 ,0xf1);
      goto LAB_0014a382;
    }
    iVar2 = uVar1 * band;
  }
  else {
    if (this->m_numTables <= band) {
      this_00 = (PreconditionViolation *)__cxa_allocate_exception(0x28);
      PreconditionViolation::PreconditionViolation
                (this_00,"band out of range",
                 "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
                 ,0xf5);
      goto LAB_0014a382;
    }
    iVar2 = uVar1 * band * this->m_numTableBands;
  }
  return *(value_type_conflict5 *)
          ((long)(this->m_tables).super_void_vector_base.m_data + (ulong)(iVar2 + uVar3) * 4);
}

Assistant:

value_type operator()( const domain_type index,
                               const unsigned int band = 0 ) const
        {
            vigra_precondition( index < m_numTableElements,
                                "index out of range" );
            if ( m_numTables == 1 ) {
                // map bands with a single (interleaved or not) table
                vigra_precondition( band < m_numTableBands,
                                    "band out of range" );
                return m_tables[ m_numTableElements * band + index ];
            } else {
                // map bands with multiple, non-interleaved tables
                vigra_precondition( band < m_numTables, "band out of range" );
                const unsigned int stride
                    = m_numTableBands * m_numTableElements;
                return m_tables[ stride * band + index ];
            }
        }